

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::GenerateBuildCommand
          (cmGlobalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makeCommand,string *makeProgram,string *param_3,string *param_4,string *targetName,
          string *param_6,bool fast,bool param_8,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makeOptions)

{
  pointer ppcVar1;
  cmake *pcVar2;
  Snapshot snapshot_00;
  bool bVar3;
  char *pcVar4;
  cmMakefile *this_00;
  allocator local_b1;
  string tname;
  cmOutputConverter conv;
  Snapshot snapshot;
  undefined8 local_48;
  undefined8 uStack_40;
  PositionType local_38;
  
  std::__cxx11::string::string((string *)&conv,"",(allocator *)&snapshot);
  cmGlobalGenerator::SelectMakeProgram(&tname,(cmGlobalGenerator *)this,makeProgram,(string *)&conv)
  ;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makeCommand,&tname
            );
  std::__cxx11::string::~string((string *)&tname);
  std::__cxx11::string::~string((string *)&conv);
  (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[3])
            (&tname,this);
  bVar3 = cmHasLiteralPrefix<std::__cxx11::string,16ul>(&tname,(char (*) [16])"NMake Makefiles");
  std::__cxx11::string::~string((string *)&tname);
  if (bVar3) {
    std::__cxx11::string::string((string *)&tname,"/NOLOGO",(allocator *)&conv);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makeCommand,
               &tname);
    std::__cxx11::string::~string((string *)&tname);
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makeCommand,
             (makeCommand->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,
             (makeOptions->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (makeOptions->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  if (targetName->_M_string_length != 0) {
    ppcVar1 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
              super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppcVar1 ==
        (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
        super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pcVar2 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
      snapshot.Position.Position = (pcVar2->CurrentSnapshot).Position.Position;
      snapshot.State = (pcVar2->CurrentSnapshot).State;
      snapshot.Position.Tree = (pcVar2->CurrentSnapshot).Position.Tree;
      cmState::Snapshot::GetDirectory((Directory *)&tname,&snapshot);
      pcVar4 = cmake::GetHomeDirectory
                         ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          CMakeInstance);
      std::__cxx11::string::string((string *)&conv,pcVar4,&local_b1);
      cmState::Directory::SetCurrentSource((Directory *)&tname,(string *)&conv);
      std::__cxx11::string::~string((string *)&conv);
      cmState::Snapshot::GetDirectory((Directory *)&tname,&snapshot);
      pcVar4 = cmake::GetHomeOutputDirectory
                         ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          CMakeInstance);
      std::__cxx11::string::string((string *)&conv,pcVar4,&local_b1);
      cmState::Directory::SetCurrentBinary((Directory *)&tname,(string *)&conv);
      std::__cxx11::string::~string((string *)&conv);
      cmState::Snapshot::SetDefaultDefinitions(&snapshot);
      this_00 = (cmMakefile *)operator_new(0x730);
      cmMakefile::cmMakefile(this_00,(cmGlobalGenerator *)this,&snapshot);
    }
    else {
      this_00 = *ppcVar1;
    }
    std::__cxx11::string::string((string *)&tname,(string *)targetName);
    if (fast) {
      std::__cxx11::string::append((char *)&tname);
    }
    cmMakefile::GetStateSnapshot(this_00);
    snapshot_00.Position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)uStack_40;
    snapshot_00.State = (cmState *)local_48;
    snapshot_00.Position.Position = local_38;
    cmOutputConverter::cmOutputConverter(&conv,snapshot_00);
    cmOutputConverter::Convert((string *)&snapshot,&conv,&tname,HOME_OUTPUT,UNCHANGED);
    std::__cxx11::string::operator=((string *)&tname,(string *)&snapshot);
    std::__cxx11::string::~string((string *)&snapshot);
    cmSystemTools::ConvertToOutputSlashes(&tname);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(makeCommand,&tname);
    if ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
        super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
        super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      cmMakefile::~cmMakefile(this_00);
      operator_delete(this_00,0x730);
    }
    std::__cxx11::string::~string((string *)&tname);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3
::GenerateBuildCommand(std::vector<std::string>& makeCommand,
                       const std::string& makeProgram,
                       const std::string& /*projectName*/,
                       const std::string& /*projectDir*/,
                       const std::string& targetName,
                       const std::string& /*config*/,
                       bool fast, bool /*verbose*/,
                       std::vector<std::string> const& makeOptions)
{
  makeCommand.push_back(
    this->SelectMakeProgram(makeProgram)
    );

  // Since we have full control over the invocation of nmake, let us
  // make it quiet.
  if (cmHasLiteralPrefix(this->GetName(), "NMake Makefiles"))
    {
    makeCommand.push_back("/NOLOGO");
    }
  makeCommand.insert(makeCommand.end(),
                     makeOptions.begin(), makeOptions.end());
  if (!targetName.empty())
    {
    cmMakefile* mf;
    if (!this->Makefiles.empty())
      {
      mf = this->Makefiles[0];
      }
    else
      {
      cmState::Snapshot snapshot = this->CMakeInstance->GetCurrentSnapshot();
      snapshot.GetDirectory().SetCurrentSource
        (this->CMakeInstance->GetHomeDirectory());
      snapshot.GetDirectory().SetCurrentBinary
        (this->CMakeInstance->GetHomeOutputDirectory());
      snapshot.SetDefaultDefinitions();
      mf = new cmMakefile(this, snapshot);
      }

    std::string tname = targetName;
    if(fast)
      {
      tname += "/fast";
      }
    cmOutputConverter conv(mf->GetStateSnapshot());
    tname = conv.Convert(tname,cmOutputConverter::HOME_OUTPUT);
    cmSystemTools::ConvertToOutputSlashes(tname);
    makeCommand.push_back(tname);
    if (this->Makefiles.empty())
      {
      delete mf;
      }
    }
}